

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int tpl_worker_hook(void *arg1,void *unused)

{
  TplTxfmStats *tpl_txfm_stats;
  byte bVar1;
  TX_SIZE tx_size;
  uint uVar2;
  int iVar3;
  AV1_COMP *cpi;
  MACROBLOCK *x;
  pthread_mutex_t *__mutex;
  AV1_PRIMARY *pAVar4;
  BLOCK_SIZE BVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int tplb_row;
  int iVar13;
  int mi_row;
  int iVar14;
  int iVar15;
  
  cpi = *arg1;
  x = *(MACROBLOCK **)((long)arg1 + 8);
  iVar9 = (cpi->ppi->tpl_data).tpl_mt_sync.num_threads_working;
  (x->e_mbd).error_info = (aom_internal_error_info *)((long)arg1 + 0x18);
  __mutex = (cpi->mt_info).tpl_row_mt.mutex_;
  iVar6 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar6 == 0) {
    tpl_txfm_stats = (TplTxfmStats *)(x[1].e_mbd.plane[0].seg_qmatrix[0] + 3);
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    BVar5 = convert_length_to_bsize((uint)(cpi->ppi->tpl_data).tpl_bsize_1d);
    tx_size = ""[BVar5];
    bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar5];
    av1_init_tpl_txfm_stats(tpl_txfm_stats);
    uVar2 = *(uint *)((long)arg1 + 0x1c8);
    iVar11 = uVar2 * bVar1;
    iVar9 = iVar9 * (uint)bVar1;
    iVar12 = iVar11 * -4 + 8;
    iVar14 = (uVar2 + 1) * (uint)bVar1;
    iVar15 = iVar14 * -4 + -8;
    iVar13 = iVar11 * -0x20;
    iVar10 = 0;
    for (iVar6 = iVar11; iVar3 = (cpi->common).mi_params.mi_rows, iVar6 < iVar3;
        iVar6 = iVar6 + iVar9) {
      iVar8 = (cpi->oxcf).border_in_pixels;
      iVar7 = iVar12 - iVar8;
      if (iVar7 <= iVar15) {
        iVar7 = iVar15;
      }
      (x->mv_limits).row_min = iVar7;
      iVar7 = iVar8 + (iVar10 + ~uVar2 * (uint)bVar1 + iVar3) * 4 + -8;
      iVar8 = ((iVar10 - iVar11) + iVar3) * 4 + 8;
      if (iVar7 < iVar8) {
        iVar8 = iVar7;
      }
      (x->mv_limits).row_max = iVar8;
      (x->e_mbd).mb_to_top_edge = iVar13;
      (x->e_mbd).mb_to_bottom_edge = ((iVar10 - iVar14) + iVar3) * 0x20;
      av1_mc_flow_dispenser_row
                (cpi,tpl_txfm_stats,(TplBuffers *)(x[1].e_mbd.plane[0].seg_iqmatrix[7] + 0x11),x,
                 iVar6,BVar5,tx_size);
      iVar12 = iVar12 + iVar9 * -4;
      iVar10 = iVar10 - iVar9;
      iVar15 = iVar15 + iVar9 * -4;
      iVar13 = iVar13 + iVar9 * -0x20;
    }
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar9 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    (cpi->mt_info).tpl_row_mt.tpl_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pAVar4 = cpi->ppi;
    BVar5 = convert_length_to_bsize((uint)(pAVar4->tpl_data).tpl_bsize_1d);
    iVar9 = ((1 << (""[BVar5] & 0x1f)) >> 1) + (cpi->common).mi_params.mi_cols >> (""[BVar5] & 0x1f)
    ;
    bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar5];
    iVar6 = 0;
    for (iVar14 = 0; iVar14 < (cpi->common).mi_params.mi_rows; iVar14 = iVar14 + (uint)bVar1) {
      (*(cpi->mt_info).tpl_row_mt.sync_write_ptr)
                (&(pAVar4->tpl_data).tpl_mt_sync,iVar6,iVar9 + -1,iVar9);
      iVar6 = iVar6 + 1;
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int tpl_worker_hook(void *arg1, void *unused) {
  (void)unused;
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1_COMP *cpi = thread_data->cpi;
  AV1_COMMON *cm = &cpi->common;
  MACROBLOCK *x = &thread_data->td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  TplTxfmStats *tpl_txfm_stats = &thread_data->td->tpl_txfm_stats;
  TplBuffers *tpl_tmp_buffers = &thread_data->td->tpl_tmp_buffers;
  CommonModeInfoParams *mi_params = &cm->mi_params;
  int num_active_workers = cpi->ppi->tpl_data.tpl_mt_sync.num_threads_working;

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &cpi->mt_info.tpl_row_mt;
  (void)tpl_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *tpl_error_mutex_ = tpl_row_mt->mutex_;
#endif

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(tpl_error_mutex_);
    tpl_row_mt->tpl_mt_exit = true;
    pthread_mutex_unlock(tpl_error_mutex_);
#endif
    set_mode_estimation_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;

  BLOCK_SIZE bsize = convert_length_to_bsize(cpi->ppi->tpl_data.tpl_bsize_1d);
  TX_SIZE tx_size = max_txsize_lookup[bsize];
  int mi_height = mi_size_high[bsize];

  av1_init_tpl_txfm_stats(tpl_txfm_stats);

  for (int mi_row = thread_data->start * mi_height; mi_row < mi_params->mi_rows;
       mi_row += num_active_workers * mi_height) {
    // Motion estimation row boundary
    av1_set_mv_row_limits(mi_params, &x->mv_limits, mi_row, mi_height,
                          cpi->oxcf.border_in_pixels);
    xd->mb_to_top_edge = -GET_MV_SUBPEL(mi_row * MI_SIZE);
    xd->mb_to_bottom_edge =
        GET_MV_SUBPEL((mi_params->mi_rows - mi_height - mi_row) * MI_SIZE);
    av1_mc_flow_dispenser_row(cpi, tpl_txfm_stats, tpl_tmp_buffers, x, mi_row,
                              bsize, tx_size);
  }
  error_info->setjmp = 0;
  return 1;
}